

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

Sign __thiscall
anon_unknown.dwarf_5db41::side3h_2d_exact_SOS
          (anon_unknown_dwarf_5db41 *this,double *p0,double *p1,double *p2,double *p3,double h0,
          double h1,double h2,double h3,bool sos)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  anon_unknown_dwarf_5db41 *paVar5;
  undefined8 uVar6;
  double *b;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  expansion *peVar12;
  index_t iVar13;
  uchar *sig;
  uchar *sig_00;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *sig_01;
  uchar *extraout_RDX_02;
  expansion *peVar14;
  expansion *this_00;
  expansion *a12;
  undefined7 in_register_00000089;
  expansion *peVar15;
  expansion *peVar16;
  expansion *this_01;
  ulong uVar17;
  double dStack_270;
  expansion local_268;
  expansion local_248;
  expansion local_228;
  expansion local_208;
  expansion local_1e8;
  expansion local_1c8 [6];
  expansion local_138;
  string local_118;
  expansion local_f8;
  expansion local_d8;
  expansion local_b8;
  undefined1 local_98 [8];
  double *p_sort [4];
  allocator local_36;
  allocator local_35;
  int local_34;
  
  peVar12 = &local_268;
  local_268.length_ = 2;
  dVar1 = *p0;
  dVar2 = *(double *)this;
  local_268.x_[1] = dVar1 - dVar2;
  local_268.x_[0] =
       (dVar1 - (local_268.x_[1] + (dVar1 - local_268.x_[1]))) + ((dVar1 - local_268.x_[1]) - dVar2)
  ;
  dVar1 = p0[1];
  dVar3 = *(double *)(this + 8);
  local_248.x_[1] = dVar1 - dVar3;
  local_248.x_[0] =
       (dVar1 - (local_248.x_[1] + (dVar1 - local_248.x_[1]))) + ((dVar1 - local_248.x_[1]) - dVar3)
  ;
  local_f8.length_ = 2;
  local_f8.capacity_ = 2;
  local_f8.x_[1] = h0 - h1;
  local_f8.x_[0] = (h0 - (local_f8.x_[1] + (h0 - local_f8.x_[1]))) + ((h0 - local_f8.x_[1]) - h1);
  dVar1 = *p1;
  local_138.x_[1] = dVar1 - dVar2;
  local_138.x_[0] =
       (dVar1 - (local_138.x_[1] + (dVar1 - local_138.x_[1]))) + ((dVar1 - local_138.x_[1]) - dVar2)
  ;
  a12 = &local_228;
  dVar1 = p1[1];
  local_228.x_[1] = dVar1 - dVar3;
  local_228.x_[0] =
       (dVar1 - (local_228.x_[1] + (dVar1 - local_228.x_[1]))) + ((dVar1 - local_228.x_[1]) - dVar3)
  ;
  local_d8.length_ = 2;
  local_d8.capacity_ = 2;
  local_d8.x_[1] = h0 - h2;
  local_d8.x_[0] = (h0 - (local_d8.x_[1] + (h0 - local_d8.x_[1]))) + ((h0 - local_d8.x_[1]) - h2);
  dVar1 = *p2;
  local_208.x_[1] = dVar1 - dVar2;
  local_208.x_[0] =
       (dVar1 - (local_208.x_[1] + (dVar1 - local_208.x_[1]))) + ((dVar1 - local_208.x_[1]) - dVar2)
  ;
  dVar1 = p2[1];
  local_1e8.x_[1] = dVar1 - dVar3;
  local_1e8.x_[0] =
       (dVar1 - (local_1e8.x_[1] + (dVar1 - local_1e8.x_[1]))) + ((dVar1 - local_1e8.x_[1]) - dVar3)
  ;
  local_b8.length_ = 2;
  local_b8.capacity_ = 2;
  local_b8.x_[1] = h0 - h3;
  local_b8.x_[0] = (h0 - (local_b8.x_[1] + (h0 - local_b8.x_[1]))) + ((h0 - local_b8.x_[1]) - h3);
  local_1c8[0].length_ = 0;
  local_1c8[0].capacity_ = 0x10;
  dStack_270 = 6.8729570806105e-318;
  local_268.capacity_ = local_268.length_;
  local_248.length_ = local_268.length_;
  local_248.capacity_ = local_268.length_;
  local_228.length_ = local_268.length_;
  local_228.capacity_ = local_268.length_;
  local_208.length_ = local_268.length_;
  local_208.capacity_ = local_268.length_;
  local_1e8.length_ = local_268.length_;
  local_1e8.capacity_ = local_268.length_;
  local_138.length_ = local_268.length_;
  local_138.capacity_ = local_268.length_;
  GEO::expansion::assign_det2x2(local_1c8,&local_138,a12,&local_208,&local_1e8);
  uVar7 = (local_248.length_ * local_208.length_ + local_1e8.length_ * local_268.length_) * 2;
  lVar10 = (ulong)uVar7 * 8 + 0x10;
  lVar11 = -lVar10;
  this_00 = (expansion *)((long)&local_268 + lVar11);
  *(undefined4 *)((long)&local_268 - lVar10) = 0;
  *(uint *)((long)&local_268 + lVar11 + 4) = uVar7;
  *(undefined8 *)((long)&dStack_270 + lVar11) = 0x153a4e;
  GEO::expansion::assign_det2x2(this_00,peVar12,&local_248,&local_208,&local_1e8);
  peVar15 = &local_138;
  uVar7 = (local_248.length_ * local_138.length_ + local_228.length_ * local_268.length_) * 2;
  lVar11 = (ulong)uVar7 * 8 + 0x10;
  peVar14 = (expansion *)((long)this_00 - lVar11);
  *(undefined4 *)((long)this_00 - lVar11) = 0;
  peVar14->capacity_ = uVar7;
  peVar14[-1].x_[1] = 6.87373276367447e-318;
  GEO::expansion::assign_det2x2(peVar14,peVar12,&local_248,peVar15,a12);
  peVar14[-1].x_[1] = 6.87377228892614e-318;
  local_34 = GEO::expansion::sign
                       (peVar14,(EVP_PKEY_CTX *)peVar12,sig,(size_t *)peVar15,(uchar *)a12,
                        CONCAT71(in_register_00000089,sos));
  if (local_34 == 0) {
    peVar14[-1].x_[1] = 6.87709735072265e-318;
    std::__cxx11::string::string((string *)local_98,"Delta3_sign != ZERO",&local_36);
    peVar14[-1].x_[1] = 6.87721098582119e-318;
    std::__cxx11::string::string
              ((string *)&local_118,
               "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
               ,&local_35);
    peVar14[-1].x_[1] = (double)&LAB_00153d73;
    GEO::geo_assertion_failed((string *)local_98,&local_118,0x5066);
  }
  uVar7 = local_1c8[0].length_ * local_f8.length_ * 2;
  lVar10 = (ulong)uVar7 * 8 + 0x10;
  peVar16 = (expansion *)((long)peVar14 - lVar10);
  peVar16->length_ = 0;
  peVar16->capacity_ = uVar7;
  peVar16[-1].x_[1] = 6.87414777881697e-318;
  GEO::expansion::assign_product(peVar16,local_1c8,&local_f8);
  uVar7 = this_00->length_ * local_d8.length_ * 2;
  lVar11 = (ulong)uVar7 * 8 + 0x10;
  this_01 = (expansion *)((long)peVar16 - lVar11);
  *(undefined4 *)((long)peVar16 - lVar11) = 0;
  this_01->capacity_ = uVar7;
  this_01[-1].x_[1] = 6.87444915886094e-318;
  GEO::expansion::assign_product(this_01,this_00,&local_d8);
  this_01[-1].x_[1] = 6.87448868411261e-318;
  peVar12 = GEO::expansion::negate(this_01);
  uVar7 = peVar14->length_ << 2;
  uVar17 = (ulong)uVar7 * 8 + 0x10 & 0x7fffffff0;
  peVar15 = (expansion *)((long)this_01 - uVar17);
  peVar15->length_ = 0;
  peVar15->capacity_ = uVar7;
  p_sort[3] = (double *)peVar14;
  peVar15[-1].x_[1] = 6.8748691146599e-318;
  GEO::expansion::assign_product(peVar15,peVar14,&local_b8);
  iVar8 = peVar12->length_ + *(int *)((long)peVar14 - lVar10);
  iVar9 = *(int *)((long)this_01 - uVar17);
  uVar17 = (ulong)(iVar8 + iVar9 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar14 = (expansion *)((long)peVar15 - uVar17);
  *(undefined4 *)((long)peVar15 - uVar17) = 0;
  peVar14->capacity_ = iVar8 + iVar9;
  peVar14[-1].x_[1] = 6.87523472323783e-318;
  GEO::expansion::assign_sum(peVar14,peVar16,peVar12,peVar15);
  peVar14[-1].x_[1] = 6.87527424848949e-318;
  iVar8 = GEO::expansion::sign
                    (peVar14,(EVP_PKEY_CTX *)peVar16,sig_00,(size_t *)peVar15,(uchar *)a12,
                     CONCAT71(in_register_00000089,sos));
  iVar9 = iVar8;
  if (iVar8 == 0) {
    peVar12 = (expansion *)(p_sort + 3);
    local_98 = (undefined1  [8])this;
    p_sort[0] = p0;
    p_sort[1] = p1;
    p_sort[2] = p2;
    peVar14[-1].x_[1] = 1.48219693752374e-323;
    uVar6 = peVar14[-1].x_[1];
    peVar14[-1].x_[1] = 6.87558056918991e-318;
    SOS_sort((double **)local_98,(double **)peVar12,(index_t)uVar6);
    sig_01 = extraout_RDX;
    for (lVar11 = 0; iVar9 = iVar8, lVar11 != 4; lVar11 = lVar11 + 1) {
      paVar5 = (anon_unknown_dwarf_5db41 *)p_sort[lVar11 + -1];
      if (paVar5 == this) {
        iVar13 = local_1c8[0].length_ + this_00->length_;
        uVar17 = (ulong)(local_1c8[0].length_ + this_00->length_ + 1) * 8 + 0x17 &
                 0xfffffffffffffff0;
        peVar15 = (expansion *)((long)peVar14 - uVar17);
        peVar15->length_ = 0;
        peVar15->capacity_ = iVar13;
        peVar15[-1].x_[1] = 6.87625743912472e-318;
        GEO::expansion::assign_diff(peVar15,this_00,local_1c8);
        b = p_sort[3];
        iVar9 = *(int *)((long)peVar14 - uVar17);
        iVar4 = *(int *)p_sort[3];
        uVar17 = (ulong)(iVar9 + iVar4 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
        peVar14 = (expansion *)((long)peVar15 - uVar17);
        *(undefined4 *)((long)peVar15 - uVar17) = 0;
        peVar14->capacity_ = iVar4 + iVar9;
        peVar14[-1].x_[1] = 6.87658846310743e-318;
        peVar12 = peVar15;
        GEO::expansion::assign_sum(peVar14,peVar15,(expansion *)b);
        sig_01 = extraout_RDX_00;
        peVar16 = peVar14;
LAB_00153ce9:
        peVar14[-1].x_[1] = 6.87667245426722e-318;
        iVar9 = GEO::expansion::sign
                          (peVar16,(EVP_PKEY_CTX *)peVar12,sig_01,(size_t *)peVar15,(uchar *)a12,
                           CONCAT71(in_register_00000089,sos));
        sig_01 = extraout_RDX_01;
        if (iVar9 != 0) break;
      }
      else {
        if (paVar5 == (anon_unknown_dwarf_5db41 *)p0) {
          peVar16 = local_1c8;
          goto LAB_00153ce9;
        }
        if (paVar5 == (anon_unknown_dwarf_5db41 *)p1) {
          peVar14[-1].x_[1] = 6.87677126739639e-318;
          iVar9 = GEO::expansion::sign
                            (this_00,(EVP_PKEY_CTX *)peVar12,sig_01,(size_t *)peVar15,(uchar *)a12,
                             CONCAT71(in_register_00000089,sos));
          sig_01 = extraout_RDX_02;
          if (iVar9 != 0) {
            return -(local_34 * iVar9);
          }
        }
        else if (paVar5 == (anon_unknown_dwarf_5db41 *)p2) {
          peVar14[-1].x_[1] = -NAN;
          return SUB84(peVar14[-1].x_[1],0);
        }
      }
    }
  }
  return iVar9 * local_34;
}

Assistant:

Sign side3h_2d_exact_SOS(
        const double* p0, const double* p1,
	const double* p2, const double* p3, 
        double h0, double h1, double h2, double h3,
        bool sos = true
    ) {

        const expansion& a11 = expansion_diff(p1[0], p0[0]);
        const expansion& a12 = expansion_diff(p1[1], p0[1]);
        const expansion& a13 = expansion_diff(h0,h1);

        const expansion& a21 = expansion_diff(p2[0], p0[0]);
        const expansion& a22 = expansion_diff(p2[1], p0[1]);
        const expansion& a23 = expansion_diff(h0,h2);

        const expansion& a31 = expansion_diff(p3[0], p0[0]);
        const expansion& a32 = expansion_diff(p3[1], p0[1]);
        const expansion& a33 = expansion_diff(h0,h3);

        const expansion& Delta1 = expansion_det2x2(
            a21, a22, 
            a31, a32
        );
        const expansion& Delta2 = expansion_det2x2(
            a11, a12,
            a31, a32
        );
        const expansion& Delta3 = expansion_det2x2(
            a11, a12,
            a21, a22
        );

        Sign Delta3_sign = Delta3.sign();
        geo_assert(Delta3_sign != ZERO);

        const expansion& r_1 = expansion_product(Delta1, a13);
        const expansion& r_2 = expansion_product(Delta2, a23).negate();
        const expansion& r_3 = expansion_product(Delta3, a33);
        const expansion& r = expansion_sum3(r_1, r_2, r_3);

        Sign r_sign = r.sign();

        // Simulation of Simplicity (symbolic perturbation)
        if(sos && r_sign == ZERO) {
            const double* p_sort[4];
            p_sort[0] = p0;
            p_sort[1] = p1;
            p_sort[2] = p2;
            p_sort[3] = p3;
            SOS_sort(p_sort, p_sort + 4, 3);
            for(index_t i = 0; i < 4; ++i) {
                if(p_sort[i] == p0) {
                    const expansion& z1 = expansion_diff(Delta2, Delta1);
                    const expansion& z = expansion_sum(z1, Delta3);
                    Sign z_sign = z.sign();
                    if(z_sign != ZERO) {
                        return Sign(Delta3_sign * z_sign);
                    }
                } else if(p_sort[i] == p1) {
                    Sign Delta1_sign = Delta1.sign();
                    if(Delta1_sign != ZERO) {
                        return Sign(Delta3_sign * Delta1_sign);
                    }
                } else if(p_sort[i] == p2) {
                    Sign Delta2_sign = Delta2.sign();
                    if(Delta2_sign != ZERO) {
                        return Sign(-Delta3_sign * Delta2_sign);
                    }
                } else if(p_sort[i] == p3) {
		    return NEGATIVE;
                } 
            }
        }
        return Sign(Delta3_sign * r_sign);
    }